

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O1

void __thiscall
spdlog::details::Y_formatter::format
          (Y_formatter *this,log_msg *param_1,tm *tm_time,memory_buffer *dest)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar5;
  scoped_pad p;
  format_int local_70;
  scoped_pad local_50;
  
  scoped_pad::scoped_pad(&local_50,4,&(this->super_flag_formatter).padinfo_,dest);
  iVar2 = tm_time->tm_year;
  uVar1 = iVar2 + 0x76c;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  pcVar4 = fmt::v5::format_int::format_decimal(&local_70,(ulong)uVar3);
  local_70.str_ = pcVar4;
  if (iVar2 < -0x76c) {
    local_70.str_ = pcVar4 + -1;
    pcVar4[-1] = '-';
  }
  pcVar4 = local_70.str_;
  __n = (long)(local_70.buffer_ + 0x15) - (long)local_70.str_;
  uVar5 = (dest->super_basic_buffer<char>).size_ + __n;
  if ((dest->super_basic_buffer<char>).capacity_ < uVar5) {
    (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest,uVar5);
  }
  if (local_70.buffer_ + 0x15 != pcVar4) {
    memmove((dest->super_basic_buffer<char>).ptr_ + (dest->super_basic_buffer<char>).size_,pcVar4,
            __n);
  }
  (dest->super_basic_buffer<char>).size_ = uVar5;
  scoped_pad::~scoped_pad(&local_50);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        const size_t field_size = 4;
        scoped_pad p(field_size, padinfo_, dest);
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }